

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

DVector2 P_GetOffsetPosition(double x,double y,double dx,double dy)

{
  line_t_conflict *src;
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  bool bVar4;
  intercept_t *piVar5;
  FLinePortal *pFVar6;
  undefined1 (*in_RDI) [16];
  double in_XMM0_Qb;
  uint uVar7;
  undefined4 uVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  DVector2 DVar11;
  undefined1 local_d8 [16];
  double local_c8;
  double adStack_c0 [2];
  double *local_b0;
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  FLinePortalTraverse it;
  
  local_d8._8_4_ = in_XMM1_Dc;
  local_d8._0_8_ = y;
  local_d8._12_4_ = in_XMM1_Dd;
  local_98._8_4_ = SUB84(dy,0);
  local_98._0_8_ = dx;
  local_98._12_4_ = (int)((ulong)dy >> 0x20);
  local_a8 = x + dx;
  dStack_a0 = y + dy;
  *(double *)*in_RDI = local_a8;
  *(double *)(*in_RDI + 8) = dStack_a0;
  if (PortalBlockmap.containsLines == true) {
    if ((dx < 128.0) && (dy < 128.0)) {
      uVar7 = (uint)((y - bmaporgy) * 0.0078125);
      uVar9 = (uint)((x - bmaporgx) * 0.0078125);
      dx = (double)CONCAT44(uVar9,uVar9);
      if (((int)(uVar7 | uVar9) < 0) ||
         (((bmapwidth <= (int)uVar9 || (bmapheight <= (int)uVar7)) ||
          (PortalBlockmap.data.Array[(int)(uVar7 * PortalBlockmap.dx + uVar9)].neighborContainsLines
           != true)))) goto LAB_0046ecbe;
    }
    local_b0 = (double *)(*in_RDI + 8);
    do {
      it.super_FPathTraverse._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006f9100;
      uVar8 = local_d8._0_4_;
      uVar10 = local_d8._4_4_;
      local_88 = x;
      dStack_80 = in_XMM0_Qb;
      FPathTraverse::init(&it.super_FPathTraverse,(EVP_PKEY_CTX *)0x9);
      piVar5 = FPathTraverse::Next(&it.super_FPathTraverse);
      dx = (double)CONCAT44(uVar10,uVar8);
      if (piVar5 == (intercept_t *)0x0) {
        bVar4 = false;
      }
      else {
        src = (piVar5->d).line;
        bVar4 = false;
        if (src->portalindex < linePortals.Count) {
          pFVar6 = linePortals.Array + src->portalindex;
        }
        else {
          pFVar6 = (FLinePortal *)0x0;
        }
        dx = (double)CONCAT44(uVar10,uVar8);
        if ((pFVar6->mFlags & 8) != 0) {
          uVar8 = it.super_FPathTraverse.trace.dx._0_4_;
          uVar10 = it.super_FPathTraverse.trace.dx._4_4_;
          local_c8 = piVar5->frac * it.super_FPathTraverse.trace.dx + it.super_FPathTraverse.trace.x
          ;
          adStack_c0[0] =
               piVar5->frac * it.super_FPathTraverse.trace.dy + it.super_FPathTraverse.trace.y;
          if (pFVar6->mType == '\x03') {
            dVar2 = (pFVar6->mDisplacement).X;
            dVar3 = (pFVar6->mDisplacement).Y;
            local_a8 = local_a8 + dVar2;
            dStack_a0 = dStack_a0 + dVar3;
            auVar1._8_4_ = SUB84(dStack_a0,0);
            auVar1._0_8_ = local_a8;
            auVar1._12_4_ = (int)((ulong)dStack_a0 >> 0x20);
            *in_RDI = auVar1;
            local_88 = local_c8 + dVar2;
            dStack_80 = adStack_c0[0] + dVar3;
            dx = local_a8;
          }
          else {
            P_TranslatePortalXY(src,&local_c8,adStack_c0);
            P_TranslatePortalXY(src,(double *)in_RDI,local_b0);
            dx = (double)CONCAT44(uVar10,uVar8);
            local_a8 = *(double *)*in_RDI;
            dStack_a0 = *(double *)(*in_RDI + 8);
            local_88 = local_c8;
            dStack_80 = adStack_c0[0];
          }
          local_98._8_8_ = dStack_a0 - dStack_80;
          local_98._0_8_ = local_a8 - local_88;
          local_d8._8_8_ = dStack_80;
          local_d8._0_8_ = dStack_80;
          bVar4 = true;
        }
      }
      FPathTraverse::~FPathTraverse(&it.super_FPathTraverse);
      x = local_88;
      in_XMM0_Qb = dStack_80;
    } while (bVar4);
  }
LAB_0046ecbe:
  DVar11.Y = dx;
  DVar11.X = x;
  return DVar11;
}

Assistant:

DVector2 P_GetOffsetPosition(double x, double y, double dx, double dy)
{
	DVector2 dest(x + dx, y + dy);
	if (PortalBlockmap.containsLines)
	{
		double actx = x, acty = y;
		// Try some easily discoverable early-out first. If we know that the trace cannot possibly find a portal, this saves us from calling the traverser completely for vast parts of the map.
		if (dx < 128 && dy < 128)
		{
			int blockx = GetBlockX(actx);
			int blocky = GetBlockY(acty);
			if (blockx < 0 || blocky < 0 || blockx >= bmapwidth || blocky >= bmapheight || !PortalBlockmap(blockx, blocky).neighborContainsLines) return dest;
		}

		bool repeat;
		do
		{
			FLinePortalTraverse it;
			it.init(actx, acty, dx, dy, PT_ADDLINES|PT_DELTA);
			intercept_t *in;

			repeat = false;
			while ((in = it.Next()))
			{
				// hit a portal line.
				line_t *line = in->d.line;
				FLinePortal *port = line->getPortal();

				// Teleport portals are intentionally ignored since skipping this stuff is their entire reason for existence.
				if (port->mFlags & PORTF_INTERACTIVE)
				{
					DVector2 hit = it.InterceptPoint(in);

					if (port->mType == PORTT_LINKED)
					{
						// optimized handling for linked portals where we only need to add an offset.
						hit += port->mDisplacement;
						dest += port->mDisplacement;
					}
					else
					{
						// interactive ones are more complex because the vector may be rotated.
						// Note: There is no z-translation here, there's just too much code in the engine that wouldn't be able to handle interactive portals with a height difference.
						P_TranslatePortalXY(line, hit.X, hit.Y);
						P_TranslatePortalXY(line, dest.X, dest.Y);
					}
					// update the fields, end this trace and restart from the new position
					dx = dest.X - hit.X;
					dy = dest.Y - hit.Y;
					actx = hit.X;
					acty = hit.Y;
					repeat = true;
				}

				break;
			}
		} while (repeat);
	}
	return dest;
}